

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bit_buf_t bVar4;
  
  if (num_bits != 0) {
    iVar2 = this->m_bit_count - num_bits;
    this->m_bit_count = iVar2;
    bVar4 = (ulong)bits << ((byte)iVar2 & 0x3f) | this->m_bit_buf;
    this->m_bit_buf = bVar4;
    this->m_total_bits_written = this->m_total_bits_written + num_bits;
    if (iVar2 < 0x39) {
      uVar3 = (this->m_output_buf).m_size;
      do {
        if ((this->m_output_buf).m_capacity <= uVar3) {
          bVar1 = elemental_vector::increase_capacity
                            ((elemental_vector *)&this->m_output_buf,uVar3 + 1,true,1,
                             (object_mover)0x0,true);
          if (!bVar1) {
            return false;
          }
          uVar3 = (this->m_output_buf).m_size;
        }
        (this->m_output_buf).m_p[uVar3] = (uchar)(bVar4 >> 0x38);
        uVar3 = (this->m_output_buf).m_size + 1;
        (this->m_output_buf).m_size = uVar3;
        bVar4 = this->m_bit_buf << 8;
        this->m_bit_buf = bVar4;
        iVar2 = this->m_bit_count;
        this->m_bit_count = iVar2 + 8;
      } while (iVar2 < 0x31);
    }
  }
  return true;
}

Assistant:

bool symbol_codec::put_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);
      LZHAM_ASSERT(m_bit_count >= 25);

      if (!num_bits)
         return true;

      m_bit_count -= num_bits;
      m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

      m_total_bits_written += num_bits;

      while (m_bit_count <= (cBitBufSize - 8))
      {
         if (!m_output_buf.try_push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8))))
            return false;

         m_bit_buf <<= 8;
         m_bit_count += 8;
      }

      return true;
   }